

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O3

string * __thiscall
nlohmann::detail::
iteration_proxy<nlohmann::detail::iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
::iteration_proxy_internal::key(string *__return_storage_ptr__,iteration_proxy_internal *this)

{
  value_t vVar1;
  pointer pbVar2;
  ulong __val;
  bool bVar3;
  char cVar4;
  ulong uVar5;
  char cVar6;
  
  pbVar2 = (this->anchor).m_object;
  if (pbVar2 == (pointer)0x0) {
    __assert_fail("anchor.m_object != nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/metricq[P]hta/lib/json/include/nlohmann/json.hpp"
                  ,0x11b4,
                  "std::string nlohmann::detail::iteration_proxy<nlohmann::detail::iter_impl<const nlohmann::basic_json<>>>::iteration_proxy_internal::key() const [IteratorType = nlohmann::detail::iter_impl<const nlohmann::basic_json<>>]"
                 );
  }
  vVar1 = pbVar2->m_type;
  if (vVar1 == object) {
    iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
    ::key(__return_storage_ptr__,&this->anchor);
  }
  else if (vVar1 == array) {
    __val = this->array_index;
    cVar6 = '\x01';
    if (9 < __val) {
      uVar5 = __val;
      cVar4 = '\x04';
      do {
        cVar6 = cVar4;
        if (uVar5 < 100) {
          cVar6 = cVar6 + -2;
          goto LAB_001656cb;
        }
        if (uVar5 < 1000) {
          cVar6 = cVar6 + -1;
          goto LAB_001656cb;
        }
        if (uVar5 < 10000) goto LAB_001656cb;
        bVar3 = 99999 < uVar5;
        uVar5 = uVar5 / 10000;
        cVar4 = cVar6 + '\x04';
      } while (bVar3);
      cVar6 = cVar6 + '\x01';
    }
LAB_001656cb:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct((ulong)__return_storage_ptr__,cVar6);
    Catch::clara::std::__detail::__to_chars_10_impl<unsigned_long>
              ((__return_storage_ptr__->_M_dataplus)._M_p,
               (uint)__return_storage_ptr__->_M_string_length,__val);
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
  }
  return __return_storage_ptr__;
}

Assistant:

std::string key() const
{
assert(anchor.m_object != nullptr);

switch (anchor.m_object->type())
{
// use integer array index as key
case value_t::array:
return std::to_string(array_index);

// use key from the object
case value_t::object:
return anchor.key();

// use an empty key for all primitive types
default:
return "";
}
}